

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O3

bool __thiscall ftxui::WideInputBase::OnMouseEvent(WideInputBase *this,Event *event)

{
  wstring *pwVar1;
  bool bVar2;
  _Any_data *p_Var3;
  int iVar4;
  _Any_data *p_Var5;
  _Any_data *p_Var6;
  int iVar7;
  wstring *pwVar8;
  _func_int **local_20;
  
  ComponentBase::CaptureMouse((ComponentBase *)&stack0xffffffffffffffe0,(Event *)this);
  if (local_20 != (_func_int **)0x0) {
    (**(code **)(*local_20 + 8))();
    bVar2 = Box::Contain(&this->input_box_,(event->field_1).mouse_.x,(event->field_1).mouse_.y);
    if (bVar2) {
      ComponentBase::TakeFocus(&this->super_ComponentBase);
      if ((event->field_1).mouse_.button != Left) {
        return true;
      }
      if ((event->field_1).mouse_.motion != Pressed) {
        return true;
      }
      p_Var5 = (_Any_data *)(this->option_).address_;
      p_Var6 = (_Any_data *)&this->option_;
      if (p_Var5 != (_Any_data *)0x0) {
        p_Var6 = p_Var5;
      }
      p_Var5 = p_Var6 + 5;
      if (*(_Any_data **)((long)p_Var6 + 0x58) != (_Any_data *)0x0) {
        p_Var5 = *(_Any_data **)((long)p_Var6 + 0x58);
      }
      pwVar1 = (this->content_).address_;
      p_Var3 = (_Any_data *)&this->cursor_position_internal_;
      if (*(int *)p_Var5 != -1) {
        p_Var3 = p_Var5;
      }
      iVar7 = ((event->field_1).mouse_.x + *(int *)p_Var3) - (this->cursor_box_).x_min;
      pwVar8 = &(this->content_).owned_;
      if (pwVar1 != (wstring *)0x0) {
        pwVar8 = pwVar1;
      }
      iVar4 = (int)pwVar8->_M_string_length;
      if (iVar4 <= iVar7) {
        iVar7 = iVar4;
      }
      iVar4 = 0;
      if (0 < iVar7) {
        iVar4 = iVar7;
      }
      if (*(int *)p_Var3 == iVar4) {
        return true;
      }
      *(int *)p_Var3 = iVar4;
      if (*(long *)(p_Var6 + 1) != 0) {
        (**(code **)((long)p_Var6 + 0x18))(p_Var6);
        return true;
      }
      std::__throw_bad_function_call();
    }
  }
  return false;
}

Assistant:

bool OnMouseEvent(Event event) {
    if (!CaptureMouse(event))
      return false;
    if (!input_box_.Contain(event.mouse().x, event.mouse().y))
      return false;

    TakeFocus();

    if (event.mouse().button == Mouse::Left &&
        event.mouse().motion == Mouse::Pressed) {
      int new_cursor_position =
          cursor_position() + event.mouse().x - cursor_box_.x_min;
      new_cursor_position =
          std::max(0, std::min<int>(content_->size(), new_cursor_position));
      if (cursor_position() != new_cursor_position) {
        cursor_position() = new_cursor_position;
        option_->on_change();
      }
    }
    return true;
  }